

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test_streamable<trng::chi_square_dist<long_double>>
               (chi_square_dist<long_double> *d)

{
  param_type pVar1;
  param_type p_new;
  StringRef local_228;
  AssertionHandler catchAssertionHandler;
  StringRef local_1d0;
  SourceLineInfo local_1c0;
  stringstream str;
  basic_ostream<char,_std::char_traits<char>_> local_1a0 [376];
  
  p_new.nu_ = 1;
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  trng::operator<<(local_1a0,&d->P);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)&str,&p_new);
  pVar1 = p_new;
  local_228.m_start = "REQUIRE";
  local_228.m_size = 7;
  local_1c0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_1c0.line = 0xcd;
  Catch::StringRef::StringRef(&local_1d0,"(d == d_new)");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,&local_228,&local_1c0,local_1d0,Normal);
  local_228.m_start = (char *)CONCAT71(local_228.m_start._1_7_,(d->P).nu_ == pVar1.nu_);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_228);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}